

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void anon_unknown.dwarf_233176::ChangeInstructionTo
               (VmModule *module,VmInstruction *inst,VmInstructionType cmd,VmValue *first,
               VmValue *second,VmValue *third,VmValue *fourth,VmValue *fifth,uint *optCount)

{
  uint uVar1;
  VmValue **ppVVar2;
  bool bVar3;
  ulong uVar4;
  SmallArray<VmValue_*,_128U> local_448;
  
  inst->cmd = cmd;
  local_448.allocator = module->allocator;
  local_448.data = local_448.little;
  local_448.count = 0;
  local_448.max = 0x80;
  uVar1 = (inst->arguments).count;
  if (0x7f < uVar1) {
    SmallArray<VmValue_*,_128U>::grow(&local_448,uVar1);
  }
  ppVVar2 = (inst->arguments).data;
  uVar1 = (inst->arguments).count;
  if (local_448.max <= local_448.count + uVar1) {
    SmallArray<VmValue_*,_128U>::grow(&local_448,local_448.count + uVar1);
  }
  if ((ulong)uVar1 != 0) {
    uVar4 = 0;
    do {
      local_448.data[local_448.count + (int)uVar4] = ppVVar2[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
    local_448.count = local_448.count + (int)uVar4;
  }
  (inst->arguments).count = 0;
  if (first != (VmValue *)0x0) {
    VmInstruction::AddArgument(inst,first);
  }
  if (second != (VmValue *)0x0) {
    if (first == (VmValue *)0x0) {
      __assert_fail("first",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x3d2,
                    "void (anonymous namespace)::ChangeInstructionTo(VmModule *, VmInstruction *, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *, unsigned int *)"
                   );
    }
    VmInstruction::AddArgument(inst,second);
  }
  if (third != (VmValue *)0x0) {
    if (second == (VmValue *)0x0) {
      __assert_fail("second",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x3d8,
                    "void (anonymous namespace)::ChangeInstructionTo(VmModule *, VmInstruction *, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *, unsigned int *)"
                   );
    }
    VmInstruction::AddArgument(inst,third);
  }
  if (fourth != (VmValue *)0x0) {
    if (third == (VmValue *)0x0) {
      __assert_fail("third",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x3de,
                    "void (anonymous namespace)::ChangeInstructionTo(VmModule *, VmInstruction *, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *, unsigned int *)"
                   );
    }
    VmInstruction::AddArgument(inst,fourth);
  }
  if (fifth != (VmValue *)0x0) {
    if (fourth == (VmValue *)0x0) {
      __assert_fail("fourth",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x3e4,
                    "void (anonymous namespace)::ChangeInstructionTo(VmModule *, VmInstruction *, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *, unsigned int *)"
                   );
    }
    VmInstruction::AddArgument(inst,fifth);
  }
  if (local_448.count != 0) {
    uVar4 = 0;
    do {
      VmValue::RemoveUse(local_448.data[uVar4],&inst->super_VmValue);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (local_448._8_8_ & 0xffffffff));
  }
  bVar3 = HasSideEffects(cmd);
  (inst->super_VmValue).hasSideEffects = bVar3;
  bVar3 = HasMemoryAccess(cmd);
  (inst->super_VmValue).hasMemoryAccess = bVar3;
  if (optCount != (uint *)0x0) {
    *optCount = *optCount + 1;
  }
  SmallArray<VmValue_*,_128U>::~SmallArray(&local_448);
  return;
}

Assistant:

void ChangeInstructionTo(VmModule *module, VmInstruction *inst, VmInstructionType cmd, VmValue *first, VmValue *second, VmValue *third, VmValue *fourth, VmValue *fifth, unsigned *optCount)
	{
		inst->cmd = cmd;

		SmallArray<VmValue*, 128> arguments(module->allocator);
		arguments.reserve(inst->arguments.size());
		arguments.push_back(inst->arguments.data, inst->arguments.size());

		inst->arguments.clear();

		if(first)
			inst->AddArgument(first);

		if(second)
		{
			assert(first);
			inst->AddArgument(second);
		}

		if(third)
		{
			assert(second);
			inst->AddArgument(third);
		}

		if(fourth)
		{
			assert(third);
			inst->AddArgument(fourth);
		}

		if(fifth)
		{
			assert(fourth);
			inst->AddArgument(fifth);
		}

		for(unsigned i = 0; i < arguments.size(); i++)
			arguments[i]->RemoveUse(inst);

		inst->hasSideEffects = HasSideEffects(cmd);
		inst->hasMemoryAccess = HasMemoryAccess(cmd);

		if(optCount)
			(*optCount)++;
	}